

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult_p.h
# Opt level: O1

void __thiscall QSqlCachedResultPrivate::~QSqlCachedResultPrivate(QSqlCachedResultPrivate *this)

{
  *(undefined ***)this = &PTR__QSqlCachedResultPrivate_0023cd48;
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&(this->cache).d);
  QSqlResultPrivate::~QSqlResultPrivate(&this->super_QSqlResultPrivate);
  operator_delete(this,0xd8);
  return;
}

Assistant:

class Q_SQL_EXPORT QSqlCachedResultPrivate: public QSqlResultPrivate
{
    Q_DECLARE_PUBLIC(QSqlCachedResult)

public:
    using QSqlResultPrivate::QSqlResultPrivate;

    bool canSeek(int i) const;
    inline int cacheCount() const;
    void init(int count, bool fo);
    void cleanup();
    int nextIndex();
    void revertLast();

    QSqlCachedResult::ValueCache cache;
    int rowCacheEnd = 0;
    int colCount = 0;
    bool atEnd = false;
}